

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O3

void av1_cnn_convolve(float **input,int in_width,int in_height,int in_stride,
                     CNN_LAYER_CONFIG *layer_config,float **output,int out_stride,int start_idx,
                     int step)

{
  int iVar1;
  PADDING_TYPE PVar2;
  uint uVar3;
  uint uVar4;
  float *pfVar5;
  float *pfVar6;
  int k_2;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  int l;
  int iVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  float *pfVar29;
  uint uVar30;
  uint uVar31;
  int k;
  uint uVar32;
  int iVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  int ii;
  int iVar37;
  ulong uVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  float fVar42;
  float fVar43;
  int local_15c;
  ulong local_150;
  ulong local_148;
  ulong local_138;
  long local_130;
  int local_11c;
  long local_118;
  long local_110;
  int local_f0;
  long local_d0;
  long local_c0;
  long local_98;
  long local_88;
  long local_70;
  
  uVar3 = layer_config->in_channels;
  uVar19 = (ulong)uVar3;
  uVar4 = layer_config->filter_width;
  uVar16 = (ulong)uVar4;
  uVar32 = layer_config->out_channels;
  uVar17 = (ulong)uVar32;
  iVar39 = uVar32 * uVar3;
  iVar10 = layer_config->filter_height;
  iVar20 = iVar10 >> 1;
  iVar18 = (int)uVar4 >> 1;
  uVar38 = 1;
  if (1 < step) {
    uVar38 = (ulong)(uint)step;
  }
  if ((layer_config->maxpool == 0) ||
     ((iVar21 = layer_config->skip_height, iVar21 < 2 && (layer_config->skip_width < 2)))) {
    if (uVar4 == 1 && iVar10 == 1) {
      if (0 < (int)uVar32) {
        uVar4 = layer_config->skip_width;
        uVar16 = (long)in_width % (long)(int)uVar4 & 0xffffffff;
        if ((int)((long)in_width % (long)(int)uVar4) == 0) {
          uVar16 = (ulong)uVar4;
        }
        iVar10 = (int)(uVar16 >> 0x1f) + (int)uVar16;
        iVar20 = uVar4 * start_idx + (iVar10 >> 0x1f & iVar10 >> 1);
        iVar10 = layer_config->skip_height;
        iVar18 = in_height % iVar10;
        if (in_height % iVar10 == 0) {
          iVar18 = iVar10;
        }
        uVar32 = iVar18 - (iVar18 >> 0x1f) >> 0x1f & iVar18 / 2;
        local_130 = 0;
        uVar16 = 0;
        do {
          local_148 = (long)(int)uVar32;
          iVar18 = start_idx;
          if ((int)uVar32 < in_height) {
            do {
              if (iVar20 < in_width) {
                lVar34 = (long)iVar18;
                pfVar5 = layer_config->bias;
                pfVar6 = output[uVar16];
                lVar36 = (long)iVar20;
                do {
                  fVar42 = pfVar5[uVar16];
                  if (0 < (int)uVar3) {
                    pfVar29 = (float *)((long)layer_config->weights + local_130);
                    uVar15 = 0;
                    do {
                      fVar42 = fVar42 + *pfVar29 *
                                        input[uVar15][lVar36 + local_148 * (long)in_stride];
                      uVar15 = uVar15 + 1;
                      pfVar29 = pfVar29 + uVar17;
                    } while (uVar19 != uVar15);
                  }
                  pfVar6[lVar34] = fVar42;
                  lVar36 = lVar36 + (int)(uVar4 * (int)uVar38);
                  lVar34 = lVar34 + uVar38;
                } while (lVar36 < in_width);
              }
              local_148 = local_148 + (long)iVar10;
              iVar18 = iVar18 + out_stride;
            } while ((long)local_148 < (long)in_height);
          }
          uVar16 = uVar16 + 1;
          local_130 = local_130 + 4;
        } while (uVar16 != uVar17);
      }
    }
    else {
      PVar2 = layer_config->pad;
      if (PVar2 == '\x02') {
        (*av1_cnn_convolve_no_maxpool_padding_valid)
                  (input,in_width,in_height,in_stride,layer_config,output,out_stride,start_idx,
                   iVar39,(int)uVar38);
      }
      else {
        iVar7 = iVar10 + -1;
        uVar27 = (iVar10 - (iVar7 >> 0x1f)) - 1;
        iVar21 = ((uVar27 & 0xfffffffe) - iVar7) + iVar20;
        iVar11 = uVar4 - 1;
        uVar31 = (uVar4 - (iVar11 >> 0x1f)) - 1;
        iVar41 = ((uVar31 & 0xfffffffe) - iVar11) + iVar18;
        if (PVar2 == '\x01') {
          iVar28 = (int)uVar27 >> 1;
          iVar7 = (int)uVar31 >> 1;
          iVar18 = layer_config->skip_width;
          iVar20 = layer_config->skip_height;
          iVar11 = in_height % iVar20;
          if (in_height % iVar20 == 0) {
            iVar11 = iVar20;
          }
          iVar11 = ((iVar10 % 2 + iVar11) - (iVar11 + iVar10 % 2 + -1 >> 0x1f)) + -1 >> 1;
          if (iVar28 <= iVar11) {
            iVar11 = iVar28;
          }
          iVar28 = in_width % iVar18;
          if (in_width % iVar18 == 0) {
            iVar28 = iVar18;
          }
          iVar28 = (((int)uVar4 % 2 + iVar28) - (iVar28 + (int)uVar4 % 2 + -1 >> 0x1f)) + -1 >> 1;
          if (iVar7 <= iVar28) {
            iVar28 = iVar7;
          }
          if (start_idx < (int)uVar32) {
            local_118 = (long)start_idx;
            do {
              if (iVar11 < in_height) {
                iVar7 = 0;
                iVar33 = iVar11 - iVar21;
                do {
                  if (iVar28 < in_width) {
                    lVar36 = (long)iVar7;
                    pfVar5 = layer_config->bias;
                    pfVar6 = output[local_118];
                    iVar12 = iVar28 - iVar41;
                    do {
                      fVar42 = pfVar5[local_118];
                      if (0 < (int)uVar3) {
                        uVar16 = 0;
                        do {
                          if (0 < iVar10) {
                            iVar9 = (int)uVar16 * uVar32 + (int)local_118;
                            iVar8 = iVar33;
                            do {
                              if (0 < (int)uVar4) {
                                iVar23 = in_height + -1;
                                if (iVar8 < in_height) {
                                  iVar23 = iVar8;
                                }
                                if (iVar8 < 0) {
                                  iVar23 = 0;
                                }
                                pfVar29 = layer_config->weights + iVar9;
                                iVar14 = iVar12;
                                do {
                                  iVar13 = in_width + -1;
                                  if (iVar14 < in_width) {
                                    iVar13 = iVar14;
                                  }
                                  if (iVar14 < 0) {
                                    iVar13 = 0;
                                  }
                                  fVar42 = fVar42 + *pfVar29 *
                                                    input[uVar16][iVar13 + iVar23 * in_stride];
                                  iVar14 = iVar14 + 1;
                                  iVar9 = iVar9 + iVar39;
                                  pfVar29 = pfVar29 + iVar39;
                                } while (iVar14 < (int)(iVar12 + uVar4));
                              }
                              iVar8 = iVar8 + 1;
                            } while (iVar8 < iVar10 + iVar33);
                          }
                          uVar16 = uVar16 + 1;
                        } while (uVar16 != uVar19);
                      }
                      pfVar6[lVar36] = fVar42;
                      iVar12 = iVar12 + iVar18;
                      lVar36 = lVar36 + 1;
                    } while (iVar12 < in_width - iVar41);
                  }
                  iVar33 = iVar33 + iVar20;
                  iVar7 = iVar7 + out_stride;
                } while (iVar33 < in_height - iVar21);
              }
              local_118 = local_118 + uVar38;
            } while (local_118 < (int)uVar32);
          }
        }
        else if (PVar2 == '\0') {
          iVar28 = layer_config->skip_width;
          iVar33 = layer_config->skip_height;
          iVar12 = in_height % iVar33;
          if (in_height % iVar33 == 0) {
            iVar12 = iVar33;
          }
          iVar10 = ((iVar10 % 2 + iVar12) - (iVar10 % 2 + iVar12 + -1 >> 0x1f)) + -1 >> 1;
          if (iVar7 / 2 <= iVar10) {
            iVar10 = iVar7 / 2;
          }
          iVar7 = in_width % iVar28;
          if (in_width % iVar28 == 0) {
            iVar7 = iVar28;
          }
          iVar7 = (((int)uVar4 % 2 + iVar7) - ((int)uVar4 % 2 + iVar7 + -1 >> 0x1f)) + -1 >> 1;
          if (iVar11 / 2 <= iVar7) {
            iVar7 = iVar11 / 2;
          }
          if (start_idx < (int)uVar32) {
            local_110 = (long)start_idx;
            do {
              if (iVar10 < in_height) {
                iVar11 = 0;
                uVar31 = iVar10 - iVar21;
                iVar12 = iVar10;
                do {
                  uVar16 = 0;
                  if (0 < (int)uVar31) {
                    uVar16 = (ulong)uVar31;
                  }
                  iVar8 = (iVar21 - iVar12) * uVar4;
                  if (iVar8 < 1) {
                    iVar8 = 0;
                  }
                  if (iVar7 < in_width) {
                    local_f0 = iVar8 * iVar39 + (int)local_110;
                    iVar8 = iVar20 + 1 + iVar12;
                    if (in_height <= iVar8) {
                      iVar8 = in_height;
                    }
                    iVar9 = iVar12 - iVar21;
                    if (iVar12 - iVar21 < 1) {
                      iVar9 = 0;
                    }
                    lVar36 = (long)iVar11;
                    pfVar5 = layer_config->bias;
                    pfVar6 = output[local_110];
                    iVar14 = iVar41 - iVar7;
                    uVar27 = iVar7 - iVar41;
                    iVar23 = iVar7;
                    do {
                      iVar26 = 0;
                      iVar13 = 0;
                      if (0 < iVar14) {
                        iVar13 = iVar14;
                      }
                      uVar17 = 0;
                      if (0 < (int)uVar27) {
                        uVar17 = (ulong)uVar27;
                      }
                      iVar40 = iVar41 - iVar23;
                      if (iVar41 - iVar23 < 1) {
                        iVar40 = iVar26;
                      }
                      iVar22 = ((iVar18 + 1) - in_width) + iVar23;
                      if (iVar22 < 1) {
                        iVar22 = iVar26;
                      }
                      fVar42 = pfVar5[local_110];
                      if (0 < (int)uVar3) {
                        iVar25 = iVar23 + iVar18 + 1;
                        if (in_width <= iVar25) {
                          iVar25 = in_width;
                        }
                        iVar1 = iVar23 - iVar41;
                        if (iVar23 - iVar41 < 1) {
                          iVar1 = iVar26;
                        }
                        uVar15 = 0;
                        do {
                          if (iVar9 < iVar8) {
                            iVar26 = (int)uVar15 * uVar32 + local_f0;
                            lVar34 = (long)in_stride * 4 * uVar16;
                            uVar35 = uVar16;
                            do {
                              if (iVar1 < iVar25) {
                                iVar26 = iVar26 + iVar13 * uVar32 * uVar3;
                                pfVar29 = layer_config->weights + iVar26;
                                uVar24 = uVar17;
                                do {
                                  fVar42 = fVar42 + *pfVar29 *
                                                    *(float *)((long)input[uVar15] +
                                                              uVar24 * 4 + lVar34);
                                  uVar24 = uVar24 + 1;
                                  iVar26 = iVar26 + iVar39;
                                  pfVar29 = pfVar29 + iVar39;
                                } while ((long)uVar24 < (long)iVar25);
                              }
                              else {
                                iVar26 = iVar26 + iVar40 * iVar39;
                              }
                              iVar26 = iVar26 + iVar22 * iVar39;
                              uVar35 = uVar35 + 1;
                              lVar34 = lVar34 + (long)in_stride * 4;
                            } while ((long)uVar35 < (long)iVar8);
                          }
                          uVar15 = uVar15 + 1;
                        } while (uVar15 != uVar19);
                      }
                      pfVar6[lVar36] = fVar42;
                      iVar23 = iVar23 + iVar28;
                      lVar36 = lVar36 + 1;
                      uVar27 = uVar27 + iVar28;
                      iVar14 = iVar14 - iVar28;
                    } while (iVar23 < in_width);
                  }
                  iVar12 = iVar12 + iVar33;
                  uVar31 = uVar31 + iVar33;
                  iVar11 = iVar11 + out_stride;
                } while (iVar12 < in_height);
              }
              local_110 = local_110 + uVar38;
            } while (local_110 < (int)uVar32);
          }
        }
      }
    }
  }
  else {
    PVar2 = layer_config->pad;
    if (PVar2 == '\x02') {
      if (0 < (int)uVar32) {
        uVar38 = 0;
        do {
          if (-1 < in_height - iVar10) {
            iVar18 = 0;
            local_c0 = 0;
            iVar20 = 0;
            do {
              iVar11 = iVar21 + iVar20;
              if (-1 < (int)(in_width - uVar4)) {
                iVar7 = in_height;
                if (iVar11 < in_height) {
                  iVar7 = iVar11;
                }
                iVar28 = layer_config->skip_width;
                local_98 = 0;
                iVar33 = 0;
                iVar41 = iVar18;
                do {
                  iVar12 = iVar28 + iVar33;
                  if (iVar20 < iVar7) {
                    iVar8 = iVar20;
                    iVar9 = iVar41;
                    iVar23 = in_width;
                    if (iVar12 < in_width) {
                      iVar23 = iVar12;
                    }
                    do {
                      if (iVar33 < iVar23) {
                        pfVar5 = layer_config->bias;
                        pfVar6 = output[uVar38];
                        iVar14 = iVar9;
                        iVar13 = iVar33;
                        do {
                          fVar42 = pfVar5[uVar38];
                          if (0 < (int)uVar3) {
                            uVar15 = 0;
                            do {
                              if (0 < iVar10) {
                                iVar40 = (int)uVar15 * uVar32 + (int)uVar38;
                                iVar22 = 0;
                                iVar26 = iVar14;
                                do {
                                  if (0 < (int)uVar4) {
                                    pfVar29 = layer_config->weights + iVar40;
                                    uVar35 = uVar16;
                                    iVar25 = iVar26;
                                    do {
                                      fVar42 = fVar42 + *pfVar29 * input[uVar15][iVar25];
                                      pfVar29 = pfVar29 + iVar39;
                                      iVar25 = iVar25 + 1;
                                      uVar35 = uVar35 - 1;
                                    } while (uVar35 != 0);
                                    iVar40 = iVar40 + iVar39 * uVar4;
                                  }
                                  iVar22 = iVar22 + 1;
                                  iVar26 = iVar26 + in_stride;
                                } while (iVar22 != iVar10);
                              }
                              uVar15 = uVar15 + 1;
                            } while (uVar15 != uVar19);
                          }
                          fVar43 = fVar42;
                          if ((iVar33 != iVar13 || iVar20 != iVar8) &&
                             (fVar43 = pfVar6[local_98 + local_c0 * out_stride], fVar43 <= fVar42))
                          {
                            fVar43 = fVar42;
                          }
                          pfVar6[local_98 + local_c0 * out_stride] = fVar43;
                          iVar13 = iVar13 + 1;
                          iVar14 = iVar14 + 1;
                        } while (iVar13 < iVar23);
                      }
                      iVar8 = iVar8 + 1;
                      iVar9 = iVar9 + in_stride;
                    } while (iVar8 < iVar7);
                  }
                  local_98 = local_98 + 1;
                  iVar41 = iVar41 + iVar28;
                  iVar33 = iVar12;
                } while (iVar12 <= (int)(in_width - uVar4));
              }
              local_c0 = local_c0 + 1;
              iVar18 = iVar18 + iVar21 * in_stride;
              iVar20 = iVar11;
            } while (iVar11 <= in_height - iVar10);
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 != uVar17);
      }
    }
    else if (PVar2 == '\x01') {
      if (0 < (int)uVar32) {
        local_150 = 0;
        do {
          if (0 < in_height) {
            local_70 = 0;
            iVar11 = 0;
            do {
              iVar7 = iVar21 + iVar11;
              if (0 < in_width) {
                iVar41 = in_height;
                if (iVar7 < in_height) {
                  iVar41 = iVar7;
                }
                iVar28 = layer_config->skip_width;
                local_c0 = 0;
                local_15c = -iVar18;
                iVar33 = 0;
                do {
                  iVar12 = iVar33 + iVar28;
                  if (iVar11 < iVar41) {
                    iVar8 = iVar11;
                    iVar9 = in_width;
                    if (iVar12 < in_width) {
                      iVar9 = iVar12;
                    }
                    do {
                      if (iVar33 < iVar9) {
                        pfVar5 = layer_config->bias;
                        pfVar6 = output[local_150];
                        iVar23 = local_15c;
                        iVar14 = iVar33;
                        do {
                          fVar42 = pfVar5[local_150];
                          if (0 < (int)uVar3) {
                            local_148 = 0;
                            do {
                              if (0 < iVar10) {
                                iVar13 = (int)local_148 * uVar32 + (int)local_150;
                                iVar26 = 0;
                                do {
                                  if (0 < (int)uVar4) {
                                    iVar22 = (iVar8 - iVar20) + iVar26;
                                    iVar40 = in_height + -1;
                                    if (iVar22 < in_height) {
                                      iVar40 = iVar22;
                                    }
                                    if (iVar22 < 0) {
                                      iVar40 = 0;
                                    }
                                    pfVar29 = layer_config->weights + iVar13;
                                    uVar38 = uVar16;
                                    iVar22 = iVar23;
                                    do {
                                      iVar25 = in_width + -1;
                                      if (iVar22 < in_width) {
                                        iVar25 = iVar22;
                                      }
                                      if (iVar22 < 0) {
                                        iVar25 = 0;
                                      }
                                      fVar42 = fVar42 + *pfVar29 *
                                                        input[local_148]
                                                        [iVar25 + iVar40 * in_stride];
                                      iVar13 = iVar13 + iVar39;
                                      pfVar29 = pfVar29 + iVar39;
                                      iVar22 = iVar22 + 1;
                                      uVar31 = (int)uVar38 - 1;
                                      uVar38 = (ulong)uVar31;
                                    } while (uVar31 != 0);
                                  }
                                  iVar26 = iVar26 + 1;
                                } while (iVar26 != iVar10);
                              }
                              local_148 = local_148 + 1;
                            } while (local_148 != uVar19);
                          }
                          fVar43 = fVar42;
                          if ((iVar33 != iVar14 || iVar11 != iVar8) &&
                             (fVar43 = pfVar6[local_c0 + local_70 * out_stride], fVar43 <= fVar42))
                          {
                            fVar43 = fVar42;
                          }
                          pfVar6[local_c0 + local_70 * out_stride] = fVar43;
                          iVar14 = iVar14 + 1;
                          iVar23 = iVar23 + 1;
                        } while (iVar14 < iVar9);
                      }
                      iVar8 = iVar8 + 1;
                    } while (iVar8 < iVar41);
                  }
                  local_c0 = local_c0 + 1;
                  local_15c = local_15c + iVar28;
                  iVar33 = iVar12;
                } while (iVar12 < in_width);
              }
              local_70 = local_70 + 1;
              iVar11 = iVar7;
            } while (iVar7 < in_height);
          }
          local_150 = local_150 + 1;
        } while (local_150 != uVar17);
      }
    }
    else if ((PVar2 == '\0') && (0 < (int)uVar32)) {
      local_138 = 0;
      do {
        if (0 < in_height) {
          local_88 = 0;
          local_11c = -(iVar20 * in_stride + iVar18);
          iVar11 = 0;
          do {
            iVar7 = iVar21 + iVar11;
            if (0 < in_width) {
              iVar41 = in_height;
              if (iVar7 < in_height) {
                iVar41 = iVar7;
              }
              iVar33 = layer_config->skip_width;
              local_d0 = 0;
              uVar31 = -iVar18;
              iVar28 = local_11c;
              iVar12 = 0;
              do {
                iVar8 = iVar12 + iVar33;
                if (iVar11 < iVar41) {
                  iVar9 = iVar11;
                  iVar23 = iVar28;
                  iVar14 = in_width;
                  if (iVar8 < in_width) {
                    iVar14 = iVar8;
                  }
                  do {
                    if (iVar12 < iVar14) {
                      pfVar5 = layer_config->bias;
                      pfVar6 = output[local_138];
                      iVar26 = iVar12;
                      uVar27 = uVar31;
                      iVar13 = iVar23;
                      do {
                        fVar42 = pfVar5[local_138];
                        if (0 < (int)uVar3) {
                          uVar38 = 0;
                          do {
                            if (0 < iVar10) {
                              iVar22 = (int)local_138 + (int)uVar38 * uVar32;
                              iVar25 = 0;
                              iVar40 = iVar13;
                              do {
                                if (0 < (int)uVar4) {
                                  iVar1 = (iVar9 - iVar20) + iVar25;
                                  lVar36 = (long)iVar22 << 2;
                                  uVar15 = uVar16;
                                  uVar30 = uVar27;
                                  iVar37 = iVar40;
                                  do {
                                    if (((-1 < iVar1) && (iVar1 < in_height)) &&
                                       (uVar30 < (uint)in_width)) {
                                      fVar42 = fVar42 + *(float *)((long)layer_config->weights +
                                                                  lVar36) * input[uVar38][iVar37];
                                    }
                                    lVar36 = lVar36 + (long)iVar39 * 4;
                                    iVar37 = iVar37 + 1;
                                    uVar30 = uVar30 + 1;
                                    uVar15 = uVar15 - 1;
                                  } while (uVar15 != 0);
                                  iVar22 = iVar22 + iVar39 * uVar4;
                                }
                                iVar25 = iVar25 + 1;
                                iVar40 = iVar40 + in_stride;
                              } while (iVar25 != iVar10);
                            }
                            uVar38 = uVar38 + 1;
                          } while (uVar38 != uVar19);
                        }
                        fVar43 = fVar42;
                        if ((iVar12 != iVar26 || iVar11 != iVar9) &&
                           (fVar43 = pfVar6[local_d0 + local_88 * out_stride], fVar43 <= fVar42)) {
                          fVar43 = fVar42;
                        }
                        pfVar6[local_d0 + local_88 * out_stride] = fVar43;
                        iVar26 = iVar26 + 1;
                        iVar13 = iVar13 + 1;
                        uVar27 = uVar27 + 1;
                      } while (iVar26 < iVar14);
                    }
                    iVar9 = iVar9 + 1;
                    iVar23 = iVar23 + in_stride;
                  } while (iVar9 < iVar41);
                }
                local_d0 = local_d0 + 1;
                iVar28 = iVar28 + iVar33;
                uVar31 = uVar31 + iVar33;
                iVar12 = iVar8;
              } while (iVar8 < in_width);
            }
            local_88 = local_88 + 1;
            local_11c = local_11c + iVar21 * in_stride;
            iVar11 = iVar7;
          } while (iVar7 < in_height);
        }
        local_138 = local_138 + 1;
      } while (local_138 != uVar17);
    }
  }
  return;
}

Assistant:

static void av1_cnn_convolve(const float **input, int in_width, int in_height,
                             int in_stride,
                             const CNN_LAYER_CONFIG *layer_config,
                             float **output, int out_stride, int start_idx,
                             int step) {
  assert(!layer_config->deconvolve);
  const int cstep = layer_config->in_channels * layer_config->out_channels;
  const int filter_height_half = layer_config->filter_height >> 1;
  const int filter_width_half = layer_config->filter_width >> 1;
  const int channel_step = AOMMAX(step, 1);

  if (layer_config->maxpool &&
      (layer_config->skip_height > 1 || layer_config->skip_width > 1)) {
    switch (layer_config->pad) {
      case PADDING_SAME_ZERO:
        convolve_maxpool_padding_zero(input, in_width, in_height, in_stride,
                                      layer_config, output, out_stride, cstep,
                                      filter_width_half, filter_height_half);
        break;
      case PADDING_SAME_REPLICATE:
        convolve_maxpool_padding_replicate(
            input, in_width, in_height, in_stride, layer_config, output,
            out_stride, cstep, filter_width_half, filter_height_half);
        break;
      case PADDING_VALID:
        convolve_maxpool_padding_valid(input, in_width, in_height, in_stride,
                                       layer_config, output, out_stride, cstep);
        break;
      default: assert(0 && "Unknown padding type");
    }
  } else {
    // Results in element-wise matrix multiplication.
    if (layer_config->filter_height == 1 && layer_config->filter_width == 1) {
      convolve_element_wise(input, in_width, in_height, in_stride, layer_config,
                            output, out_stride, start_idx, step);
      return;
    }
    const int ii_shift =
        filter_height_half - (layer_config->filter_height - 1) % 2;
    const int jj_shift =
        filter_width_half - (layer_config->filter_width - 1) % 2;
    switch (layer_config->pad) {
      case PADDING_SAME_ZERO:
        convolve_no_maxpool_padding_zero(
            input, in_width, in_height, in_stride, layer_config, output,
            out_stride, start_idx, cstep, filter_width_half, filter_height_half,
            ii_shift, jj_shift, channel_step);
        break;
      case PADDING_SAME_REPLICATE:
        convolve_no_maxpool_padding_replicate(
            input, in_width, in_height, in_stride, layer_config, output,
            out_stride, start_idx, cstep, ii_shift, jj_shift, channel_step);
        break;
      case PADDING_VALID:
        av1_cnn_convolve_no_maxpool_padding_valid(
            input, in_width, in_height, in_stride, layer_config, output,
            out_stride, start_idx, cstep, channel_step);
        break;
      default: assert(0 && "Unknown padding type");
    }
  }
}